

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int __thiscall
CVmObjBigNum::getp_get_prec(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  int iVar2;
  
  if (getp_get_prec(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_prec();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_prec::desc);
  if (iVar2 == 0) {
    uVar1 = *(ushort *)(this->super_CVmObject).ext_;
    retval->typ = VM_INT;
    *(uint *)&retval->val = (uint)uVar1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_get_prec(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return an integer giving my precision */
    retval->set_int(get_prec(ext_));

    /* handled */
    return TRUE;
}